

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O3

void __thiscall
duel::playCard(duel *this,hand *hand__,hand *enemyHand,field *field__,field *enemyField,
              uint position)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> lVar9;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> __first;
  duel *pdVar10;
  bool bVar11;
  card temp;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_88;
  undefined1 local_80 [24];
  duel *local_68;
  undefined8 local_60;
  uint local_58;
  _Alloc_hider local_50;
  _Map_pointer local_48;
  char local_40 [16];
  
  uVar8 = (ulong)position;
  pcVar1 = (hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = ((long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) * -0x5555555555555555;
  local_68 = this;
  if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    goto LAB_001045f6;
  }
  local_58 = pcVar1[uVar8].value;
  local_60 = *(_Elt_pointer *)(pcVar1 + uVar8);
  local_50._M_p = local_40;
  _Var2._M_p = pcVar1[uVar8].name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_Var2._M_p,_Var2._M_p + pcVar1[uVar8].name._M_string_length);
  if (local_58 < 3) {
    local_88._M_x = (unsigned_long)(local_80 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_50._M_p,local_50._M_p + (long)local_48);
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if ((iVar3 != 0) ||
       (bVar11 = true,
       (field__->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].bolted == true)) {
      bVar11 = local_60._4_4_ == 4;
    }
    lVar9._M_x = local_88._M_x;
    if ((duel *)local_88._M_x != (duel *)(local_80 + 8)) {
      operator_delete((void *)local_88._M_x);
    }
    if (bVar11) goto LAB_001042a5;
  }
  else {
LAB_001042a5:
    lVar9._M_x = (unsigned_long)&field__->field_;
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)lVar9._M_x,(card *)&local_60);
  }
  switch(local_60._4_4_) {
  case 1:
    pcVar1 = (enemyField->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1[-1].bolted = true;
    if (pcVar1[-1].cardType == 4) {
      uVar4 = enemyField->pile >> 1;
    }
    else {
      uVar4 = enemyField->pile - pcVar1[-1].value;
    }
    enemyField->pile = uVar4;
    break;
  case 2:
    lVar9._M_x = (unsigned_long)local_80;
    local_88._M_x._0_4_ = field__->pile;
    std::vector<card,_std::allocator<card>_>::vector
              ((vector<card,_std::allocator<card>_> *)lVar9._M_x,&field__->field_);
    field__->pile = enemyField->pile;
    std::vector<card,_std::allocator<card>_>::operator=(&field__->field_,&enemyField->field_);
    enemyField->pile = (uint)local_88._M_x;
    std::vector<card,_std::allocator<card>_>::operator=
              (&enemyField->field_,(vector<card,_std::allocator<card>_> *)lVar9._M_x);
    std::vector<card,_std::allocator<card>_>::~vector
              ((vector<card,_std::allocator<card>_> *)lVar9._M_x);
    break;
  case 3:
    uVar7 = std::chrono::_V2::system_clock::now();
    __first._M_current =
         (enemyHand->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_88._M_x = uVar7 % 0x7fffffff + (ulong)(uVar7 % 0x7fffffff == 0);
    std::
    shuffle<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              (__first,(enemyHand->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_88);
    uVar4 = pickCard((duel *)__first._M_current,enemyHand,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Card discarded was ",0x13);
    uVar8 = (ulong)uVar4;
    pcVar1 = (enemyHand->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(enemyHand->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) * -0x5555555555555555;
    if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
LAB_001045f6:
      uVar6 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      _Unwind_Resume(uVar6);
    }
    _Var2._M_p = pcVar1[uVar8].name._M_dataplus._M_p;
    local_88._M_x = (unsigned_long)(local_80 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,_Var2._M_p,_Var2._M_p + pcVar1[uVar8].name._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_88._M_x,local_80._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    lVar9._M_x = local_88._M_x;
    if ((duel *)local_88._M_x != (duel *)(local_80 + 8)) {
      operator_delete((void *)local_88._M_x);
    }
    discardCard((duel *)lVar9._M_x,uVar4,enemyHand);
    lVar9._M_x = (unsigned_long)enemyHand;
    hand::sortHand(enemyHand);
    break;
  case 4:
    field__->pile = field__->pile << 1;
    goto LAB_001045b3;
  default:
    pdVar10 = (duel *)(local_80 + 8);
    local_88._M_x = (unsigned_long)pdVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_50._M_p,local_50._M_p + (long)local_48);
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    lVar9._M_x = local_88._M_x;
    if (iVar3 == 0) {
      bVar11 = (field__->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].bolted;
      if ((duel *)local_88._M_x != pdVar10) {
        operator_delete((void *)local_88._M_x);
      }
      if (bVar11 != false) {
        pcVar1 = (field__->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar1[-1].bolted = false;
        uVar4 = field__->pile;
        if (pcVar1[-1].cardType != 4) {
          uVar4 = pcVar1[-1].value;
        }
        field__->pile = uVar4 + field__->pile;
        break;
      }
    }
    else if ((duel *)local_88._M_x != pdVar10) {
      operator_delete((void *)local_88._M_x);
    }
    field__->pile = field__->pile + local_58;
  }
  if (local_60._4_4_ == 3) {
    discardCard((duel *)lVar9._M_x,position,hand__);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Now play another card.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    pdVar10 = local_68;
    printField(local_68);
    uVar4 = pickCard(pdVar10,hand__,false);
    playCard(local_68,hand__,enemyHand,field__,enemyField,uVar4);
  }
  else {
LAB_001045b3:
    discardCard((duel *)lVar9._M_x,position,hand__);
  }
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void duel::playCard(hand &hand__, hand &enemyHand, field &field__, field &enemyField, unsigned int position) {
    // create pointer to card that is played
    /*unique_ptr<card> temp(&hand__.hand_.at(position));*/
	card temp = hand__.hand_.at(position);
    // put the card on the field if it has a value > 2 or if it is a '1' card and pile isn't bolted is or if it is force
    if( (temp.getValue() > 2 || (temp.getName()=="1" && !isBolted(field__)))
    || (isForce(temp))) field__.field_.emplace_back(temp);
    switch (temp.getCardType()) {
        // bolt, nullify a cards value/effect
        case 1:
            enemyField.field_.back().setBolted(true);
            // if enemy used force, revert it; else subtract the enemy's top card value
            if (isForce(enemyField.field_.back())) enemyField.setPile(enemyField.getPile() / 2);
            else enemyField.setPile(enemyField.getPile() - enemyField.field_.back().getValue());
            break;
        //mirror, swaps the fields
        case 2:
            swap(field__, enemyField);
            break;
        // blast, shuffles enemy hand and lets you choose which card from that hand to discard
        case 3:
            unsigned int enemyPosition;
            enemyHand.shuffleHand();
            // discard a card from the enemy's Hand
            enemyPosition = pickCard(enemyHand,true);
            cout << "Card discarded was " << enemyHand.hand_.at(enemyPosition).getName() << "." << endl;
            discardCard(enemyPosition, enemyHand);
            // sort it back
            enemyHand.sortHand();
            break;
        // force, doubles pile
        case 4:
            field__.setPile(field__.getPile() * 2);
            break;
        // regular card
        default:
            // if card played is '1' and top card on field is bolted, unbolt it
            if(temp.getName()=="1" && isBolted(field__)) {
                field__.field_.back().setBolted(false);
                // if bolted card was force, double pile; else add the bolted card's value back to pile
                if(isForce(field__.field_.back())) field__.setPile(field__.getPile() * 2);
                else field__.setPile(field__.getPile() + field__.field_.back().getValue());
            }
            // add value to pile when above condition is false
            else field__.setPile(field__.getPile() + temp.getValue());
            break;
    }
    // if blast was played, discard blast and play another card
    if(temp.getCardType() == 3) {
        discardCard(position,hand__);
        cout << "Now play another card." << endl;
        printField();
        playCard(hand__,enemyHand,field__,enemyField,pickCard(hand__,false));
    }
    // else discard card used from hand
    else discardCard(position,hand__);
}